

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::SumBatches::forward_impl
          (SumBatches *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  pointer ppTVar6;
  Tensor *pTVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  long lVar18;
  PointerType pfVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  Index index_1;
  ulong uVar26;
  Index dstRows;
  long lVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> res;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  add_assign_op<float,_float> local_115;
  uint local_114;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_110;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_108;
  PointerType local_e8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  local_e0;
  DstEvaluatorType local_c0;
  undefined1 local_a8 [16];
  variable_if_dynamic<long,__1> local_98;
  float *local_90;
  ulong local_80;
  float *local_78;
  ulong local_68;
  float *local_60;
  ulong local_50;
  float *local_48;
  ulong local_38;
  
  ppTVar6 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_110 = xs;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 != 8) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,900,
                  "virtual void cnn::SumBatches::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar21 = ((*ppTVar6)->d).bd;
  Tensor::operator*(&local_108,fx);
  uVar33 = uVar21 & 3;
  local_114 = uVar21;
  switch(uVar33) {
  case 0:
    if ((local_108.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value |
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    uVar25 = local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar26 = uVar25;
    if ((((ulong)local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar26 = (ulong)(-((uint)((ulong)local_108.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 3),
       (long)uVar25 <= (long)uVar26)) {
      uVar26 = uVar25;
    }
    uVar32 = uVar25 - uVar26;
    uVar22 = uVar32 + 3;
    if (-1 < (long)uVar32) {
      uVar22 = uVar32;
    }
    pfVar19 = local_108.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    if (0 < (long)uVar26) {
      local_e8 = local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
      memset(local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data,0,uVar26 * 4);
      pfVar19 = local_e8;
    }
    lVar27 = (uVar22 & 0xfffffffffffffffc) + uVar26;
    if (3 < (long)uVar32) {
      lVar18 = uVar26 + 4;
      if ((long)(uVar26 + 4) < lVar27) {
        lVar18 = lVar27;
      }
      memset(pfVar19 + uVar26,0,(~uVar26 + lVar18 & 0xfffffffffffffffc) * 4 + 0x10);
    }
    if (uVar25 - lVar27 != 0 && lVar27 <= (long)uVar25) {
      memset(pfVar19 + ((long)uVar22 >> 2) * 4 + uVar26,0,(uVar25 - lVar27) * 4);
    }
    break;
  case 1:
    pTVar7 = *(local_110->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    local_a8._0_8_ = pTVar7->v;
    local_a8._8_8_ = ZEXT48((pTVar7->d).d[0]);
    local_98.m_value = 1;
    if (1 < (pTVar7->d).nd) {
      local_98.m_value = (long)(pTVar7->d).d[1];
    }
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
    ::operator=(&local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                ,(MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  *)local_a8);
    break;
  case 2:
    pTVar7 = *(local_110->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar25 = (ulong)(pTVar7->d).nd;
    uVar21 = 1;
    uVar26 = (ulong)(pTVar7->d).d[1];
    if (uVar25 < 2) {
      uVar26 = 1;
    }
    if (uVar25 != 0) {
      uVar22 = 0;
      do {
        uVar21 = uVar21 * (pTVar7->d).d[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar25 != uVar22);
    }
    uVar25 = 0;
    if ((pTVar7->d).bd != 1) {
      uVar25 = (ulong)uVar21;
    }
    if ((local_108.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != (ulong)(pTVar7->d).d[0]) ||
       (local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != uVar26)) {
LAB_001a5823:
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                   );
    }
    pfVar8 = pTVar7->v;
    uVar22 = local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar26 = uVar22;
    if ((((ulong)local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar26 = (ulong)(-((uint)((ulong)local_108.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 3),
       (long)uVar22 <= (long)uVar26)) {
      uVar26 = uVar22;
    }
    uVar28 = uVar22 - uVar26;
    uVar32 = uVar28 + 3;
    if (-1 < (long)uVar28) {
      uVar32 = uVar28;
    }
    if (0 < (long)uVar26) {
      uVar30 = 0;
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar30] = pfVar8[uVar30] + pfVar8[uVar25 + uVar30];
        uVar30 = uVar30 + 1;
      } while (uVar26 != uVar30);
    }
    lVar27 = (uVar32 & 0xfffffffffffffffc) + uVar26;
    if (3 < (long)uVar28) {
      do {
        pfVar1 = pfVar8 + uVar26;
        fVar9 = pfVar1[1];
        fVar10 = pfVar1[2];
        fVar11 = pfVar1[3];
        pfVar2 = pfVar8 + uVar25 + uVar26;
        fVar12 = pfVar2[1];
        fVar13 = pfVar2[2];
        fVar14 = pfVar2[3];
        pfVar3 = local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data + uVar26;
        *pfVar3 = *pfVar2 + *pfVar1;
        pfVar3[1] = fVar12 + fVar9;
        pfVar3[2] = fVar13 + fVar10;
        pfVar3[3] = fVar14 + fVar11;
        uVar26 = uVar26 + 4;
      } while ((long)uVar26 < lVar27);
    }
    if (lVar27 < (long)uVar22) {
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar27] = pfVar8[lVar27] + pfVar8[uVar25 + lVar27];
        lVar27 = lVar27 + 1;
      } while (uVar22 - lVar27 != 0);
    }
    break;
  case 3:
    pTVar7 = *(local_110->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar26 = (ulong)(pTVar7->d).nd;
    iVar24 = 1;
    uVar21 = (pTVar7->d).d[1];
    if (uVar26 < 2) {
      uVar21 = 1;
    }
    uVar5 = (pTVar7->d).bd;
    uVar20 = 1;
    if (uVar26 != 0) {
      uVar25 = 0;
      do {
        uVar20 = uVar20 * (pTVar7->d).d[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar26 != uVar25);
    }
    uVar25 = 0;
    if (uVar5 != 1) {
      uVar25 = (ulong)uVar20;
    }
    if (uVar26 != 0) {
      iVar24 = 1;
      uVar22 = 0;
      do {
        iVar24 = iVar24 * (pTVar7->d).d[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar26 != uVar22);
    }
    if ((local_108.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != (ulong)(pTVar7->d).d[0]) ||
       (local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != (ulong)uVar21)) goto LAB_001a5823;
    pfVar8 = pTVar7->v;
    uVar21 = (int)(2 % (ulong)uVar5) * iVar24;
    uVar22 = local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar26 = uVar22;
    if ((((ulong)local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar26 = (ulong)(-((uint)((ulong)local_108.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 3),
       (long)uVar22 <= (long)uVar26)) {
      uVar26 = uVar22;
    }
    uVar28 = uVar22 - uVar26;
    uVar32 = uVar28 + 3;
    if (-1 < (long)uVar28) {
      uVar32 = uVar28;
    }
    if (0 < (long)uVar26) {
      uVar30 = 0;
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar30] = pfVar8[uVar30] + pfVar8[uVar25 + uVar30] + pfVar8[uVar21 + uVar30];
        uVar30 = uVar30 + 1;
      } while (uVar26 != uVar30);
    }
    lVar27 = (uVar32 & 0xfffffffffffffffc) + uVar26;
    if (3 < (long)uVar28) {
      do {
        pfVar1 = pfVar8 + uVar26;
        fVar9 = pfVar1[1];
        fVar10 = pfVar1[2];
        fVar11 = pfVar1[3];
        pfVar2 = pfVar8 + uVar25 + uVar26;
        fVar12 = pfVar2[1];
        fVar13 = pfVar2[2];
        fVar14 = pfVar2[3];
        pfVar3 = pfVar8 + uVar21 + uVar26;
        fVar15 = pfVar3[1];
        fVar16 = pfVar3[2];
        fVar17 = pfVar3[3];
        pfVar4 = local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data + uVar26;
        *pfVar4 = *pfVar3 + *pfVar2 + *pfVar1;
        pfVar4[1] = fVar15 + fVar12 + fVar9;
        pfVar4[2] = fVar16 + fVar13 + fVar10;
        pfVar4[3] = fVar17 + fVar14 + fVar11;
        uVar26 = uVar26 + 4;
      } while ((long)uVar26 < lVar27);
    }
    if (lVar27 < (long)uVar22) {
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar27] = pfVar8[lVar27] + pfVar8[uVar25 + lVar27] + pfVar8[(ulong)uVar21 + lVar27];
        lVar27 = lVar27 + 1;
      } while (uVar22 - lVar27 != 0);
    }
  }
  if (3 < local_114) {
    do {
      pTVar7 = *(local_110->
                super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar21 = (pTVar7->d).nd;
      uVar26 = (ulong)uVar21;
      iVar24 = 1;
      iVar29 = 1;
      if (uVar26 != 0) {
        uVar25 = 0;
        do {
          iVar29 = iVar29 * (pTVar7->d).d[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar26 != uVar25);
      }
      uVar5 = (pTVar7->d).bd;
      uVar25 = (ulong)(pTVar7->d).d[1];
      if (uVar21 < 2) {
        uVar25 = 1;
      }
      if (uVar26 != 0) {
        iVar24 = 1;
        uVar22 = 0;
        do {
          iVar24 = iVar24 * (pTVar7->d).d[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar26 != uVar22);
      }
      local_48 = pTVar7->v;
      local_80 = (ulong)(pTVar7->d).d[0];
      iVar23 = 1;
      iVar31 = 1;
      if (uVar26 != 0) {
        uVar22 = 0;
        do {
          iVar31 = iVar31 * (pTVar7->d).d[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar26 != uVar22);
      }
      if (uVar26 != 0) {
        iVar23 = 1;
        uVar22 = 0;
        do {
          iVar23 = iVar23 * (pTVar7->d).d[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar26 != uVar22);
      }
      local_90 = local_48 + (uVar33 % uVar5) * iVar29;
      local_78 = local_48 + ((uVar33 + 1) % uVar5) * iVar24;
      local_60 = local_48 + ((uVar33 + 2) % uVar5) * iVar31;
      local_48 = local_48 + ((uVar33 + 3) % uVar5) * iVar23;
      local_68 = local_80;
      local_50 = local_80;
      local_38 = local_80;
      if ((local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value != local_80) ||
         (local_108.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != uVar25)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_108.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_e0.m_dst = &local_c0;
      local_e0.m_src = (SrcEvaluatorType *)local_a8;
      local_e0.m_functor = &local_115;
      local_e0.m_dstExpr = &local_108;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
      ::run(&local_e0);
      uVar33 = uVar33 + 4;
    } while (uVar33 < local_114);
  }
  return;
}

Assistant:

void SumBatches::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  assert(i == 0);
#if HAVE_CUDA
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, fx.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v + i * dEdxi.d.batch_size(), 1));
#else
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    dEdxi.batch_matrix(i) += *dEdf;
#endif
}